

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f * Matrix4f::rotateZ(float radians)

{
  Matrix4f *in_RDI;
  float in_XMM0_Da;
  double dVar1;
  double dVar2;
  float s;
  float c;
  
  dVar1 = cos((double)in_XMM0_Da);
  dVar2 = sin((double)in_XMM0_Da);
  Matrix4f(in_RDI,(float)dVar1,-(float)dVar2,0.0,0.0,(float)dVar2,(float)dVar1,0.0,0.0,0.0,0.0,1.0,
           0.0,0.0,0.0,0.0,1.0);
  return in_RDI;
}

Assistant:

Matrix4f Matrix4f::rotateZ( float radians )
{
	float c = cos( radians );
	float s = sin( radians );

	return Matrix4f
	(
		c, -s, 0, 0,
		s, c, 0, 0,
		0, 0, 1, 0,
		0, 0, 0, 1
	);
}